

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCodeMetadataCount
          (BinaryReaderIR *this,Index function_index,Index count)

{
  reference ppFVar1;
  Index count_local;
  Index function_index_local;
  BinaryReaderIR *this_local;
  
  ppFVar1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::operator[]
                      (&this->module_->funcs,(ulong)function_index);
  CodeMetadataExprQueue::push_func(&this->code_metadata_queue_,*ppFVar1);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnCodeMetadataCount(Index function_index, Index count) {
  code_metadata_queue_.push_func(module_->funcs[function_index]);
  return Result::Ok;
}